

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O0

int __thiscall DTSStreamReader::syncInfo16be(DTSStreamReader *this,uint8_t *p_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int ext_descr;
  int pi_ext_coding;
  int i_lfe;
  int frame_size;
  uint8_t *p_buf_local;
  DTSStreamReader *this_local;
  
  this->nblks = (p_buf[4] & 1) << 6 | (int)(uint)p_buf[5] >> 2;
  bVar1 = p_buf[5];
  bVar2 = p_buf[6];
  bVar3 = p_buf[7];
  this->pi_audio_mode = (p_buf[7] & 0xf) << 2 | (int)(uint)p_buf[8] >> 6;
  this->pi_sample_rate_index = (int)(uint)p_buf[8] >> 2 & 0xf;
  this->pi_bit_rate_index = (p_buf[8] & 3) << 3 | (int)(uint)p_buf[9] >> 5;
  if (((int)(uint)p_buf[10] >> 1 & 3U) != 0) {
    this->pi_audio_mode = this->pi_audio_mode | 0x10000;
  }
  if (((int)(uint)p_buf[10] >> 4 & 1U) == 0) {
    this->core_ext_mask = 0;
  }
  else {
    this->core_ext_mask = dca_ext_audio_descr_mask[(int)(uint)p_buf[10] >> 5];
  }
  return ((bVar1 & 3) << 0xc | (uint)bVar2 << 4 | (int)(uint)bVar3 >> 4) + 1;
}

Assistant:

int DTSStreamReader::syncInfo16be(const uint8_t* p_buf)
{
    nblks = (p_buf[4] & 0x01) << 6 | p_buf[5] >> 2;
    const int frame_size = (p_buf[5] & 0x03) << 12 | p_buf[6] << 4 | p_buf[7] >> 4;
    pi_audio_mode = (p_buf[7] & 0x0f) << 2 | p_buf[8] >> 6;
    pi_sample_rate_index = (p_buf[8] >> 2) & 0x0f;
    pi_bit_rate_index = (p_buf[8] & 0x03) << 3 | ((p_buf[9] >> 5) & 0x07);
    const int i_lfe = (p_buf[10] >> 1) & 0x03;
    if (i_lfe)
        pi_audio_mode |= 0x10000;

    const int pi_ext_coding = (p_buf[10] >> 4) & 0x01;
    if (pi_ext_coding)
    {
        const int ext_descr = p_buf[10] >> 5;
        core_ext_mask = dca_ext_audio_descr_mask[ext_descr];
    }
    else
    {
        core_ext_mask = 0;
    }

    return frame_size + 1;
}